

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O0

void debugDecompress(uint32_t offset,uint32_t size,istream *in,bool isSwitch)

{
  Size size_00;
  Size size_01;
  undefined1 uVar1;
  uchar *puVar2;
  char *__s;
  char *pcVar3;
  string_type *__source;
  size_type sVar4;
  byte in_CL;
  char *in_RDX;
  _Ios_Seekdir in_EDI;
  Image img;
  ofstream out;
  int i;
  ChunkHeader header;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  ChunkHeader *in_stack_fffffffffffffb90;
  Size in_stack_fffffffffffffb98;
  Image *in_stack_fffffffffffffba0;
  uchar *in_stack_fffffffffffffba8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffbb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  format fVar5;
  undefined7 in_stack_fffffffffffffbc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *pcVar6;
  allocator<char> local_3f9;
  ChunkHeader *in_stack_fffffffffffffc08;
  istream *in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffc20;
  Image *in_stack_fffffffffffffc28;
  Size in_stack_fffffffffffffc30;
  string local_3b8 [32];
  string local_398 [76];
  uint local_34c;
  uint uStack_348;
  Size local_344;
  undefined4 local_33c;
  undefined4 local_338;
  undefined4 uStack_334;
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  char local_2b0 [516];
  int local_ac;
  ushort local_6a;
  ushort local_68;
  Image local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  char *local_10;
  _Ios_Seekdir local_4;
  
  local_30.field_2._M_local_buf[0xf] = in_CL & 1;
  local_10 = in_RDX;
  local_4 = in_EDI;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x10a3f6);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffbb0,(size_type)in_stack_fffffffffffffba8,
             (allocator_type *)in_stack_fffffffffffffba0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x10a41c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10a429);
  std::istream::seekg((long)local_10,local_4);
  ChunkHeader::ChunkHeader(in_stack_fffffffffffffb90);
  operator>>(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  std::istream::seekg((long)local_10,local_4);
  this_00 = &local_30;
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10a4a2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  std::istream::read(local_10,(long)puVar2);
  local_ac = 0;
  pcVar6 = local_10;
  while( true ) {
    __s = (char *)(long)local_ac;
    pcVar3 = (char *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
    if (pcVar3 <= __s) break;
    this = &local_30;
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10a50d);
    __source = (string_type *)(puVar2 + local_ac);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
    uVar1 = decompressHigu((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__source,
                           (uint8_t *)this,(int)((ulong)in_stack_fffffffffffffba8 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffffba8 >> 0x18,0));
    if ((bool)uVar1) {
      std::__cxx11::to_string((int)((ulong)pcVar6 >> 0x20));
      std::operator+((char *)in_stack_fffffffffffffb98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90);
      std::ofstream::ofstream(local_2b0,local_2d0,_S_bin);
      std::__cxx11::string::~string(local_2d0);
      std::__cxx11::string::~string(local_2f0);
      std::__cxx11::string::~string(local_310);
      in_stack_fffffffffffffba0 = &local_60;
      in_stack_fffffffffffffba8 =
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10a609);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffba0)
      ;
      std::ostream::write(local_2b0,(long)in_stack_fffffffffffffba8);
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60);
      if ((ulong)(long)(int)((uint)local_6a * (uint)local_68 + 0x400) <= sVar4) {
        local_338 = 0;
        uStack_334 = 0;
        local_33c = 0;
        size_00.height._3_1_ = uVar1;
        size_00._0_7_ = in_stack_fffffffffffffbc0;
        Image::Image((Image *)this,size_00,SUB84((ulong)__source >> 0x20,0));
        fVar5 = (format)((ulong)this >> 0x38);
        local_34c = (uint)local_6a;
        uStack_348 = (uint)local_68;
        size_01.height._0_2_ = local_68;
        size_01.width = local_34c;
        size_01.height._2_2_ = 0;
        in_stack_fffffffffffffb98 = align(size_01);
        local_344 = in_stack_fffffffffffffb98;
        getIndexed(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc30,
                   (bool)in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18);
        std::__cxx11::to_string((int)((ulong)pcVar6 >> 0x20));
        std::operator+((char *)in_stack_fffffffffffffb98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb90);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb98,(char *)in_stack_fffffffffffffb90);
        std::filesystem::__cxx11::path::path
                  ((path *)CONCAT17(uVar1,in_stack_fffffffffffffbc0),__source,fVar5);
        in_stack_fffffffffffffb90 = (ChunkHeader *)&local_3f9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,__s,(allocator<char> *)CONCAT17(uVar1,in_stack_fffffffffffffbc0));
        Image::writePNG(in_stack_fffffffffffffba0,(path *)in_stack_fffffffffffffb98,
                        (string *)in_stack_fffffffffffffb90);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffc08);
        std::allocator<char>::~allocator(&local_3f9);
        std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffffb90);
        std::__cxx11::string::~string(local_398);
        std::__cxx11::string::~string(local_3b8);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffc28);
        Image::~Image((Image *)0x10a81e);
      }
      std::ofstream::~ofstream(local_2b0);
    }
    local_ac = local_ac + 1;
  }
  ChunkHeader::~ChunkHeader(in_stack_fffffffffffffb90);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffba0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffba0);
  return;
}

Assistant:

void debugDecompress(uint32_t offset, uint32_t size, std::istream &in, bool isSwitch) {
	std::vector<uint8_t> data(size);
	std::vector<uint8_t> output;
	in.seekg(offset, in.beg);
	ChunkHeader header;
	in >> header;
	in.seekg(offset, in.beg);
	in.read((char *)data.data(), data.size());

	for (int i = 0; i < data.size(); i++) {
		if (decompressHigu(output, data.data() + i, (int)data.size() - i, isSwitch)) {
			std::ofstream out("/tmp/chunks/data" + std::to_string(i) + ".dat", std::ios::binary);
			out.write((char *)output.data(), output.size());
			if (output.size() >= 1024 + header.w * header.h) {
				Image img({0, 0});
				getIndexed(img, output, align({header.w, header.h}), isSwitch);
				img.writePNG("/tmp/chunks/data" + std::to_string(i) + ".png");
			}
		}
	}
}